

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_insertproxymodel.cpp
# Opt level: O0

void InsertProxyModel::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QModelIndex *_t1;
  QModelIndex *_t2;
  undefined4 *puVar1;
  code *pcVar2;
  byte bVar3;
  bool bVar4;
  Int value;
  int iVar5;
  QMetaType QVar6;
  QFlag local_c0;
  QFlags<InsertProxyModel::InsertDirection> local_bc;
  byte *local_b8;
  void *_v_1;
  InsertProxyModel *_t_2;
  int *local_a0;
  void *_v;
  InsertProxyModel *_t_1;
  int *result;
  QMetaType local_80 [2];
  QMetaType local_70;
  QMetaType local_68 [2];
  Int local_58;
  bool _r_1;
  bool _r;
  QList<int> local_48;
  QObject *local_28;
  InsertProxyModel *_t;
  void **_a_local;
  int _id_local;
  Call _c_local;
  QObject *_o_local;
  
  _t = (InsertProxyModel *)_a;
  _a_local._0_4_ = _id;
  _a_local._4_4_ = _c;
  __id_local = _o;
  if (_c == InvokeMetaMethod) {
    local_28 = _o;
    switch(_id) {
    case 0:
      dataForCornerChanged((InsertProxyModel *)_o,(QVector<int> *)_a[1]);
      break;
    case 1:
      extraDataChanged((InsertProxyModel *)_o,(QModelIndex *)_a[1],(QModelIndex *)_a[2],
                       (QVector<int> *)_a[3]);
      break;
    case 2:
      _t1 = (QModelIndex *)_a[1];
      _t2 = (QModelIndex *)_a[2];
      local_48.d.d = (Data *)0x0;
      local_48.d.ptr = (int *)0x0;
      local_48.d.size = 0;
      QList<int>::QList(&local_48);
      extraDataChanged((InsertProxyModel *)_o,_t1,_t2,&local_48);
      QList<int>::~QList(&local_48);
      break;
    case 3:
      mergeDisplayEditChanged((InsertProxyModel *)_o,(bool)(*_a[1] & 1));
      break;
    case 4:
      local_58 = *_a[1];
      insertDirectionChanged((InsertProxyModel *)_o,(InsertDirections)local_58);
      break;
    case 5:
      bVar3 = (**(code **)(*(long *)_o + 0x1d8))();
      if (*(long *)_t != 0) {
        **(byte **)_t = bVar3 & 1;
      }
      break;
    case 6:
      bVar3 = (**(code **)(*(long *)_o + 0x1e0))();
      if (*(long *)_t != 0) {
        **(byte **)_t = bVar3 & 1;
      }
    }
  }
  else if (_c == RegisterMethodArgumentMetaType) {
    if (_id == 0) {
      if (*_a[1] == 0) {
        QVar6 = QMetaType::fromType<QList<int>>();
        **(undefined8 **)_t = QVar6.d_ptr;
      }
      else {
        memset(&local_70,0,8);
        QMetaType::QMetaType(&local_70);
        **(undefined8 **)_t = local_70.d_ptr;
      }
    }
    else if (_id == 1) {
      if (*_a[1] == 2) {
        QVar6 = QMetaType::fromType<QList<int>>();
        **(undefined8 **)_t = QVar6.d_ptr;
      }
      else {
        memset(local_80,0,8);
        QMetaType::QMetaType(local_80);
        **(undefined8 **)_t = local_80[0].d_ptr;
      }
    }
    else {
      memset(local_68,0,8);
      QMetaType::QMetaType(local_68);
      **(undefined8 **)_t = local_68[0].d_ptr;
    }
  }
  else if (_c == IndexOfMethod) {
    puVar1 = (undefined4 *)*_a;
    pcVar2 = *_a[1];
    if (pcVar2 == dataForCornerChanged && (pcVar2 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0)
       ) {
      *puVar1 = 0;
    }
    else {
      pcVar2 = *_a[1];
      if (pcVar2 == extraDataChanged && (pcVar2 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0))
      {
        *puVar1 = 1;
      }
      else {
        pcVar2 = *_a[1];
        if (pcVar2 == mergeDisplayEditChanged &&
            (pcVar2 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0)) {
          *puVar1 = 3;
        }
        else {
          pcVar2 = *_a[1];
          if (pcVar2 == insertDirectionChanged &&
              (pcVar2 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0)) {
            *puVar1 = 4;
          }
        }
      }
    }
  }
  else if (_c == ReadProperty) {
    local_a0 = (int *)*_a;
    _v = _o;
    if (_id == 0) {
      _t_2._0_4_ = insertDirection((InsertProxyModel *)_o);
      value = QFlags::operator_cast_to_unsigned_int((QFlags *)&_t_2);
      QFlag::QFlag((QFlag *)((long)&_t_2 + 4),value);
      iVar5 = QFlag::operator_cast_to_int((QFlag *)((long)&_t_2 + 4));
      *local_a0 = iVar5;
    }
    else if (_id == 1) {
      bVar4 = mergeDisplayEdit((InsertProxyModel *)_o);
      *(bool *)local_a0 = bVar4;
    }
  }
  else if (_c == WriteProperty) {
    local_b8 = (byte *)*_a;
    _v_1 = _o;
    if (_id == 0) {
      QFlag::QFlag(&local_c0,*(int *)local_b8);
      QFlags<InsertProxyModel::InsertDirection>::QFlags(&local_bc,local_c0);
      setInsertDirection((InsertProxyModel *)_o,&local_bc);
    }
    else if (_id == 1) {
      setMergeDisplayEdit((InsertProxyModel *)_o,(bool)(*local_b8 & 1));
    }
  }
  return;
}

Assistant:

void InsertProxyModel::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<InsertProxyModel *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->dataForCornerChanged((*reinterpret_cast< std::add_pointer_t<QList<int>>>(_a[1]))); break;
        case 1: _t->extraDataChanged((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QList<int>>>(_a[3]))); break;
        case 2: _t->extraDataChanged((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[2]))); break;
        case 3: _t->mergeDisplayEditChanged((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 4: _t->insertDirectionChanged((*reinterpret_cast< std::add_pointer_t<InsertDirections>>(_a[1]))); break;
        case 5: { bool _r = _t->commitRow();
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 6: { bool _r = _t->commitColumn();
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        default: ;
        }
    } else if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 0:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QList<int> >(); break;
            }
            break;
        case 1:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 2:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QList<int> >(); break;
            }
            break;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (InsertProxyModel::*)(const QVector<int> & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&InsertProxyModel::dataForCornerChanged)) {
                *result = 0;
                return;
            }
        }
        {
            using _t = void (InsertProxyModel::*)(const QModelIndex & , const QModelIndex & , const QVector<int> & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&InsertProxyModel::extraDataChanged)) {
                *result = 1;
                return;
            }
        }
        {
            using _t = void (InsertProxyModel::*)(bool );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&InsertProxyModel::mergeDisplayEditChanged)) {
                *result = 3;
                return;
            }
        }
        {
            using _t = void (InsertProxyModel::*)(InsertDirections );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&InsertProxyModel::insertDirectionChanged)) {
                *result = 4;
                return;
            }
        }
    }
#ifndef QT_NO_PROPERTIES
    else if (_c == QMetaObject::ReadProperty) {
        auto *_t = static_cast<InsertProxyModel *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<int*>(_v) = QFlag(_t->insertDirection()); break;
        case 1: *reinterpret_cast< bool*>(_v) = _t->mergeDisplayEdit(); break;
        default: break;
        }
    } else if (_c == QMetaObject::WriteProperty) {
        auto *_t = static_cast<InsertProxyModel *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setInsertDirection(QFlag(*reinterpret_cast<int*>(_v))); break;
        case 1: _t->setMergeDisplayEdit(*reinterpret_cast< bool*>(_v)); break;
        default: break;
        }
    } else if (_c == QMetaObject::ResetProperty) {
    } else if (_c == QMetaObject::BindableProperty) {
    }
#endif // QT_NO_PROPERTIES
}